

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::SolverParameter::InternalSerializeWithCachedSizesToArray
          (SolverParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  char *data;
  NetParameter *pNVar5;
  NetState *this_00;
  void *pvVar6;
  bool bVar7;
  SolverParameter *pSVar8;
  uint uVar9;
  Type *pTVar10;
  LogMessage *pLVar11;
  Type *this_01;
  Type *this_02;
  Rep *pRVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  bool bVar17;
  undefined7 in_register_00000031;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  byte *pbVar21;
  LogFinisher local_79;
  uint local_78;
  undefined4 local_74;
  SolverParameter *local_70;
  LogMessage local_68;
  
  local_74 = (undefined4)CONCAT71(in_register_00000031,deterministic);
  local_78 = (this->_has_bits_).has_bits_[0];
  if ((local_78 & 1) != 0) {
    psVar4 = (this->train_net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.train_net");
    psVar4 = (this->train_net_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  iVar2 = (this->test_net_).super_RepeatedPtrFieldBase.current_size_;
  local_70 = this;
  if (0 < iVar2) {
    this_03 = &this->test_net_;
    iVar20 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_03->super_RepeatedPtrFieldBase,iVar20);
      data = (pTVar10->_M_dataplus)._M_p;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_03->super_RepeatedPtrFieldBase,iVar20);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar10->_M_string_length,SERIALIZE,"caffe.SolverParameter.test_net");
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_03->super_RepeatedPtrFieldBase,iVar20);
      *target = 0x12;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar10,target + 1);
      iVar20 = iVar20 + 1;
    } while (iVar2 != iVar20);
  }
  pSVar8 = local_70;
  uVar3 = (local_70->test_iter_).current_size_;
  if (uVar3 != 0) {
    pRVar12 = (local_70->test_iter_).rep_;
    if (pRVar12 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar12 = (pSVar8->test_iter_).rep_;
    }
    uVar14 = 1;
    if (1 < (int)uVar3) {
      uVar14 = (ulong)uVar3;
    }
    uVar15 = 0;
    do {
      uVar18 = (ulong)pRVar12->elements[uVar15];
      pbVar21 = target + 1;
      *target = 0x18;
      uVar19 = uVar18;
      if (0x7f < uVar18) {
        do {
          *pbVar21 = (byte)uVar18 | 0x80;
          uVar19 = uVar18 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar17 = 0x3fff < uVar18;
          uVar18 = uVar19;
        } while (bVar17);
      }
      *pbVar21 = (byte)uVar19;
      target = pbVar21 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar14);
  }
  uVar3 = local_78;
  if ((local_78 >> 9 & 1) != 0) {
    uVar14 = (ulong)pSVar8->test_interval_;
    pbVar21 = target + 1;
    *target = 0x20;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((local_78 >> 10 & 1) != 0) {
    fVar1 = pSVar8->base_lr_;
    *target = 0x2d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((local_78 >> 0xb & 1) != 0) {
    uVar14 = (ulong)pSVar8->display_;
    pbVar21 = target + 1;
    *target = 0x30;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((local_78 >> 0xc & 1) != 0) {
    uVar14 = (ulong)pSVar8->max_iter_;
    pbVar21 = target + 1;
    *target = 0x38;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  cVar16 = (char)local_78;
  if ((local_78 & 2) != 0) {
    psVar4 = (pSVar8->lr_policy_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.lr_policy");
    psVar4 = (pSVar8->lr_policy_).ptr_;
    *target = 0x42;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    fVar1 = pSVar8->gamma_;
    *target = 0x4d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar3 >> 0xe & 1) != 0) {
    fVar1 = pSVar8->power_;
    *target = 0x55;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((short)uVar3 < 0) {
    fVar1 = pSVar8->momentum_;
    *target = 0x5d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar3 >> 0x10 & 1) != 0) {
    fVar1 = pSVar8->weight_decay_;
    *target = 0x65;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    uVar14 = (ulong)pSVar8->stepsize_;
    pbVar21 = target + 1;
    *target = 0x68;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 >> 0x12 & 1) != 0) {
    uVar14 = (ulong)pSVar8->snapshot_;
    pbVar21 = target + 1;
    *target = 0x70;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 & 4) != 0) {
    psVar4 = (pSVar8->snapshot_prefix_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.snapshot_prefix");
    psVar4 = (pSVar8->snapshot_prefix_).ptr_;
    *target = 0x7a;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  if ((uVar3 >> 0x15 & 1) != 0) {
    bVar17 = pSVar8->snapshot_diff_;
    target[0] = 0x80;
    target[1] = 1;
    target[2] = bVar17;
    target = target + 3;
  }
  if ((uVar3 >> 0x1a & 1) != 0) {
    uVar14 = (ulong)pSVar8->solver_mode_;
    pbVar21 = target + 2;
    target[0] = 0x88;
    target[1] = 1;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 >> 0x13 & 1) != 0) {
    uVar14 = (ulong)pSVar8->device_id_;
    pbVar21 = target + 2;
    target[0] = 0x90;
    target[1] = 1;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 >> 0x14 & 1) != 0) {
    bVar17 = pSVar8->test_compute_loss_;
    target[0] = 0x98;
    target[1] = 1;
    target[2] = bVar17;
    target = target + 3;
  }
  if ((uVar3 >> 0x19 & 1) != 0) {
    uVar14 = pSVar8->random_seed_;
    target[0] = 0xa0;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  bVar17 = SUB41(local_74,0);
  if ((uVar3 & 0x40) != 0) {
    pNVar5 = pSVar8->train_net_param_;
    target[0] = 0xaa;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar13 = pNVar5->_cached_size_;
    uVar9 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar21 = (byte)uVar13 | 0x80;
        uVar9 = uVar13 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar7 = 0x3fff < uVar13;
        uVar13 = uVar9;
      } while (bVar7);
    }
    *pbVar21 = (byte)uVar9;
    target = NetParameter::InternalSerializeWithCachedSizesToArray(pNVar5,bVar17,pbVar21 + 1);
  }
  iVar2 = (pSVar8->test_net_param_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar20 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
                          (&(pSVar8->test_net_param_).super_RepeatedPtrFieldBase,iVar20);
      target[0] = 0xb2;
      target[1] = 1;
      pbVar21 = target + 2;
      uVar13 = this_01->_cached_size_;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar21 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar7 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar7);
      }
      *pbVar21 = (byte)uVar9;
      target = NetParameter::InternalSerializeWithCachedSizesToArray(this_01,bVar17,pbVar21 + 1);
      iVar20 = iVar20 + 1;
    } while (iVar20 != iVar2);
  }
  pSVar8 = local_70;
  if ((uVar3 >> 0x16 & 1) != 0) {
    bVar7 = local_70->debug_info_;
    target[0] = 0xb8;
    target[1] = 1;
    target[2] = bVar7;
    target = target + 3;
  }
  if ((uVar3 & 8) != 0) {
    psVar4 = (local_70->net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.net");
    psVar4 = (pSVar8->net_).ptr_;
    target[0] = 0xc2;
    target[1] = 1;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 2);
  }
  if (cVar16 < '\0') {
    pNVar5 = pSVar8->net_param_;
    target[0] = 0xca;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar13 = pNVar5->_cached_size_;
    uVar9 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar21 = (byte)uVar13 | 0x80;
        uVar9 = uVar13 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar7 = 0x3fff < uVar13;
        uVar13 = uVar9;
      } while (bVar7);
    }
    *pbVar21 = (byte)uVar9;
    target = NetParameter::InternalSerializeWithCachedSizesToArray(pNVar5,bVar17,pbVar21 + 1);
  }
  if ((uVar3 >> 8 & 1) != 0) {
    this_00 = pSVar8->train_state_;
    target[0] = 0xd2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar13 = this_00->_cached_size_;
    uVar9 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar21 = (byte)uVar13 | 0x80;
        uVar9 = uVar13 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar13;
        uVar13 = uVar9;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar9;
    target = NetState::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar21 + 1);
  }
  iVar2 = (pSVar8->test_state_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar20 = 0;
    do {
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
                          (&(pSVar8->test_state_).super_RepeatedPtrFieldBase,iVar20);
      target[0] = 0xda;
      target[1] = 1;
      pbVar21 = target + 2;
      uVar13 = this_02->_cached_size_;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar21 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar17 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar17);
      }
      *pbVar21 = (byte)uVar9;
      target = NetState::InternalSerializeWithCachedSizesToArray(this_02,false,pbVar21 + 1);
      iVar20 = iVar20 + 1;
    } while (iVar20 != iVar2);
  }
  if ((uVar3 >> 0x1c & 1) != 0) {
    bVar17 = pSVar8->snapshot_after_train_;
    target[0] = 0xe0;
    target[1] = 1;
    target[2] = bVar17;
    target = target + 3;
  }
  if ((uVar3 & 0x10) != 0) {
    psVar4 = (pSVar8->regularization_type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.regularization_type");
    psVar4 = (pSVar8->regularization_type_).ptr_;
    target[0] = 0xea;
    target[1] = 1;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 2);
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    uVar14 = (ulong)pSVar8->solver_type_;
    pbVar21 = target + 2;
    target[0] = 0xf0;
    target[1] = 1;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 >> 0x1d & 1) != 0) {
    fVar1 = pSVar8->delta_;
    target[0] = 0xfd;
    target[1] = 1;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar3 >> 0x1b & 1) != 0) {
    bVar17 = pSVar8->test_initialization_;
    target[0] = 0x80;
    target[1] = 2;
    target[2] = bVar17;
    target = target + 3;
  }
  if ((uVar3 >> 0x1e & 1) != 0) {
    uVar14 = (ulong)pSVar8->average_loss_;
    pbVar21 = target + 2;
    target[0] = 0x88;
    target[1] = 2;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  uVar3 = (pSVar8->stepvalue_).current_size_;
  if (uVar3 != 0) {
    pRVar12 = (pSVar8->stepvalue_).rep_;
    if (pRVar12 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar12 = (pSVar8->stepvalue_).rep_;
    }
    uVar14 = 1;
    if (1 < (int)uVar3) {
      uVar14 = (ulong)uVar3;
    }
    uVar15 = 0;
    do {
      uVar18 = (ulong)pRVar12->elements[uVar15];
      pbVar21 = target + 2;
      target[0] = 0x90;
      target[1] = 2;
      uVar19 = uVar18;
      if (0x7f < uVar18) {
        do {
          *pbVar21 = (byte)uVar18 | 0x80;
          uVar19 = uVar18 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar17 = 0x3fff < uVar18;
          uVar18 = uVar19;
        } while (bVar17);
      }
      *pbVar21 = (byte)uVar19;
      target = pbVar21 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar14);
  }
  if ((int)local_78 < 0) {
    fVar1 = pSVar8->clip_gradients_;
    target[0] = 0x9d;
    target[1] = 2;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  uVar3 = (pSVar8->_has_bits_).has_bits_[1];
  if ((uVar3 & 1) != 0) {
    uVar14 = (ulong)pSVar8->iter_size_;
    pbVar21 = target + 2;
    target[0] = 0xa0;
    target[1] = 2;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 & 2) != 0) {
    uVar14 = (ulong)pSVar8->snapshot_format_;
    pbVar21 = target + 2;
    target[0] = 0xa8;
    target[1] = 2;
    uVar15 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar15 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar17 = 0x3fff < uVar14;
        uVar14 = uVar15;
      } while (bVar17);
    }
    *pbVar21 = (byte)uVar15;
    target = pbVar21 + 1;
  }
  if ((uVar3 & 4) != 0) {
    fVar1 = pSVar8->rms_decay_;
    target[0] = 0xb5;
    target[1] = 2;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  uVar3 = (pSVar8->_has_bits_).has_bits_[0];
  if ((uVar3 >> 0x18 & 1) != 0) {
    fVar1 = pSVar8->momentum2_;
    target[0] = 0xbd;
    target[1] = 2;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar3 & 0x20) != 0) {
    psVar4 = (pSVar8->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.type");
    psVar4 = (pSVar8->type_).ptr_;
    target[0] = 0xc2;
    target[1] = 2;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 2);
  }
  pvVar6 = (pSVar8->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar6 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SolverParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SolverParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string train_net = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->train_net().data(), this->train_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.train_net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->train_net(), target);
  }

  // repeated string test_net = 2;
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->test_net(i).data(), this->test_net(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.test_net");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->test_net(i), target);
  }

  // repeated int32 test_iter = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(3, this->test_iter_, target);

  // optional int32 test_interval = 4 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->test_interval(), target);
  }

  // optional float base_lr = 5;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->base_lr(), target);
  }

  // optional int32 display = 6;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6, this->display(), target);
  }

  // optional int32 max_iter = 7;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7, this->max_iter(), target);
  }

  // optional string lr_policy = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->lr_policy().data(), this->lr_policy().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.lr_policy");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->lr_policy(), target);
  }

  // optional float gamma = 9;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(9, this->gamma(), target);
  }

  // optional float power = 10;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(10, this->power(), target);
  }

  // optional float momentum = 11;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(11, this->momentum(), target);
  }

  // optional float weight_decay = 12;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->weight_decay(), target);
  }

  // optional int32 stepsize = 13;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(13, this->stepsize(), target);
  }

  // optional int32 snapshot = 14 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(14, this->snapshot(), target);
  }

  // optional string snapshot_prefix = 15;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->snapshot_prefix().data(), this->snapshot_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.snapshot_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        15, this->snapshot_prefix(), target);
  }

  // optional bool snapshot_diff = 16 [default = false];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->snapshot_diff(), target);
  }

  // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      17, this->solver_mode(), target);
  }

  // optional int32 device_id = 18 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(18, this->device_id(), target);
  }

  // optional bool test_compute_loss = 19 [default = false];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(19, this->test_compute_loss(), target);
  }

  // optional int64 random_seed = 20 [default = -1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(20, this->random_seed(), target);
  }

  // optional .caffe.NetParameter train_net_param = 21;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->train_net_param_, deterministic, target);
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  for (unsigned int i = 0, n = this->test_net_param_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, this->test_net_param(i), deterministic, target);
  }

  // optional bool debug_info = 23 [default = false];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(23, this->debug_info(), target);
  }

  // optional string net = 24;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->net().data(), this->net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        24, this->net(), target);
  }

  // optional .caffe.NetParameter net_param = 25;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->net_param_, deterministic, target);
  }

  // optional .caffe.NetState train_state = 26;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->train_state_, deterministic, target);
  }

  // repeated .caffe.NetState test_state = 27;
  for (unsigned int i = 0, n = this->test_state_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, this->test_state(i), deterministic, target);
  }

  // optional bool snapshot_after_train = 28 [default = true];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(28, this->snapshot_after_train(), target);
  }

  // optional string regularization_type = 29 [default = "L2"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->regularization_type().data(), this->regularization_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.regularization_type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        29, this->regularization_type(), target);
  }

  // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      30, this->solver_type(), target);
  }

  // optional float delta = 31 [default = 1e-08];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(31, this->delta(), target);
  }

  // optional bool test_initialization = 32 [default = true];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(32, this->test_initialization(), target);
  }

  // optional int32 average_loss = 33 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(33, this->average_loss(), target);
  }

  // repeated int32 stepvalue = 34;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(34, this->stepvalue_, target);

  // optional float clip_gradients = 35 [default = -1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(35, this->clip_gradients(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional int32 iter_size = 36 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(36, this->iter_size(), target);
  }

  // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      37, this->snapshot_format(), target);
  }

  // optional float rms_decay = 38 [default = 0.99];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(38, this->rms_decay(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional float momentum2 = 39 [default = 0.999];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(39, this->momentum2(), target);
  }

  // optional string type = 40 [default = "SGD"];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        40, this->type(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SolverParameter)
  return target;
}